

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O3

SQBool __thiscall RefTable::Release(RefTable *this,SQObject *obj)

{
  SQUnsignedInteger *pSVar1;
  SQTable *pSVar2;
  RefNode *pRVar3;
  RefNode **ppRVar4;
  SQBool SVar5;
  SQObjectPtr o;
  RefNode *prev;
  SQHash mainpos;
  SQObjectPtr local_30;
  RefNode *local_20;
  SQHash local_18;
  
  SVar5 = 0;
  pRVar3 = Get(this,obj,&local_18,&local_20,false);
  if (pRVar3 != (RefNode *)0x0) {
    pSVar1 = &pRVar3->refs;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      local_30.super_SQObject._type = (pRVar3->obj).super_SQObject._type;
      local_30.super_SQObject._unVal = (SQObjectValue)(pRVar3->obj).super_SQObject._unVal.pTable;
      if ((local_30.super_SQObject._type >> 0x1b & 1) != 0) {
        pSVar1 = &((local_30.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      ppRVar4 = &local_20->next;
      if (local_20 == (RefNode *)0x0) {
        ppRVar4 = this->_buckets + local_18;
      }
      *ppRVar4 = pRVar3->next;
      pRVar3->next = this->_freelist;
      this->_slotused = this->_slotused - 1;
      this->_freelist = pRVar3;
      pSVar2 = (pRVar3->obj).super_SQObject._unVal.pTable;
      (pRVar3->obj).super_SQObject._type = OT_NULL;
      (pRVar3->obj).super_SQObject._unVal.pTable = (SQTable *)0x0;
      if ((local_30.super_SQObject._type >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar2->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(pSVar2->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2]
          )();
        }
      }
      SQObjectPtr::~SQObjectPtr(&local_30);
      SVar5 = 1;
    }
    else {
      SVar5 = 0;
    }
  }
  return SVar5;
}

Assistant:

SQBool RefTable::Release(SQObject &obj)
{
    SQHash mainpos;
    RefNode *prev;
    RefNode *ref = Get(obj,mainpos,&prev,false);
    if(ref) {
        if(--ref->refs == 0) {
            SQObjectPtr o = ref->obj;
            if(prev) {
                prev->next = ref->next;
            }
            else {
                _buckets[mainpos] = ref->next;
            }
            ref->next = _freelist;
            _freelist = ref;
            _slotused--;
            ref->obj.Null();
            //<<FIXME>>test for shrink?
            return SQTrue;
        }
    }
    else {
        assert(0);
    }
    return SQFalse;
}